

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcCom.c
# Opt level: O0

int Abc_CommandWriteWlc(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Wlc_Ntk_t *pWVar4;
  char *pcVar5;
  int fVerbose;
  int c;
  int fNoFlops;
  int fSplitNodes;
  int fAddCos;
  char *pFileName;
  Wlc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pWVar4 = Wlc_AbcGetNtk(pAbc);
  fNoFlops = 0;
  bVar1 = false;
  fVerbose = 0;
  bVar2 = false;
  Extra_UtilGetoptReset();
LAB_003e6f3b:
  iVar3 = Extra_UtilGetopt(argc,argv,"anfvh");
  if (iVar3 == -1) {
    if (pWVar4 == (Wlc_Ntk_t *)0x0) {
      Abc_Print(1,"Abc_CommandWriteWlc(): There is no current design.\n");
    }
    else {
      if (argc == globalUtilOptind) {
        _fSplitNodes = Extra_FileNameGenericAppend(pWVar4->pName,"_out.v");
      }
      else {
        if (argc != globalUtilOptind + 1) {
          printf("Output file name should be given on the command line.\n");
          return 0;
        }
        _fSplitNodes = argv[globalUtilOptind];
      }
      pcVar5 = Extra_FileNameExtension(_fSplitNodes);
      iVar3 = strcmp(pcVar5,"ndr");
      if (iVar3 == 0) {
        Wlc_WriteNdr(pWVar4,_fSplitNodes);
      }
      else if (bVar1) {
        pWVar4 = Wlc_NtkDupSingleNodes(pWVar4);
        Wlc_WriteVer(pWVar4,_fSplitNodes,fNoFlops,fVerbose);
        Wlc_NtkFree(pWVar4);
      }
      else {
        Wlc_WriteVer(pWVar4,_fSplitNodes,fNoFlops,fVerbose);
      }
    }
    return 0;
  }
  switch(iVar3) {
  case 0x61:
    fNoFlops = fNoFlops ^ 1;
    goto LAB_003e6f3b;
  default:
    break;
  case 0x66:
    fVerbose = fVerbose ^ 1;
    goto LAB_003e6f3b;
  case 0x68:
    break;
  case 0x6e:
    bVar1 = (bool)(bVar1 ^ 1);
    goto LAB_003e6f3b;
  case 0x76:
    goto switchD_003e6f79_caseD_76;
  }
  Abc_Print(-2,"usage: %%write [-anfvh]\n");
  Abc_Print(-2,"\t         writes the design into a file\n");
  pcVar5 = "no";
  if (fNoFlops != 0) {
    pcVar5 = "yes";
  }
  Abc_Print(-2,"\t-a     : toggle adding a CO for each node [default = %s]\n",pcVar5);
  pcVar5 = "no";
  if (bVar1) {
    pcVar5 = "yes";
  }
  Abc_Print(-2,"\t-n     : toggle splitting into individual nodes [default = %s]\n",pcVar5);
  pcVar5 = "no";
  if (fVerbose != 0) {
    pcVar5 = "yes";
  }
  Abc_Print(-2,"\t-f     : toggle skipping flops when writing file [default = %s]\n",pcVar5);
  pcVar5 = "no";
  if (bVar2) {
    pcVar5 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
switchD_003e6f79_caseD_76:
  bVar2 = (bool)(bVar2 ^ 1);
  goto LAB_003e6f3b;
}

Assistant:

int Abc_CommandWriteWlc( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Wlc_Ntk_t * pNtk = Wlc_AbcGetNtk(pAbc);
    char * pFileName = NULL;
    int fAddCos      =    0; 
    int fSplitNodes  =    0; 
    int fNoFlops     =    0;
    int c, fVerbose  =    0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "anfvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'a':
            fAddCos ^= 1;
            break;
        case 'n':
            fSplitNodes ^= 1;
            break;
        case 'f':
            fNoFlops ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( 1, "Abc_CommandWriteWlc(): There is no current design.\n" );
        return 0;
    }
    if ( argc == globalUtilOptind )
        pFileName = Extra_FileNameGenericAppend( pNtk->pName, "_out.v" );
    else if ( argc == globalUtilOptind + 1 )
        pFileName = argv[globalUtilOptind];
    else
    {
        printf( "Output file name should be given on the command line.\n" );
        return 0;
    }
    if ( !strcmp( Extra_FileNameExtension(pFileName), "ndr" )  )
        Wlc_WriteNdr( pNtk, pFileName );
    else if ( fSplitNodes )
    {
        pNtk = Wlc_NtkDupSingleNodes( pNtk );
        Wlc_WriteVer( pNtk, pFileName, fAddCos, fNoFlops );
        Wlc_NtkFree( pNtk );
    }
    else
        Wlc_WriteVer( pNtk, pFileName, fAddCos, fNoFlops );

    return 0;
usage:
    Abc_Print( -2, "usage: %%write [-anfvh]\n" );
    Abc_Print( -2, "\t         writes the design into a file\n" );
    Abc_Print( -2, "\t-a     : toggle adding a CO for each node [default = %s]\n",       fAddCos? "yes": "no" );
    Abc_Print( -2, "\t-n     : toggle splitting into individual nodes [default = %s]\n", fSplitNodes? "yes": "no" );
    Abc_Print( -2, "\t-f     : toggle skipping flops when writing file [default = %s]\n",fNoFlops? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",    fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}